

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crt_abstractions.c
# Opt level: O0

float strtof_s(char *nptr,char **endptr)

{
  FLOAT_STRING_TYPE FVar1;
  int *piVar2;
  double dVar3;
  float local_44;
  float result;
  double val;
  char *runner;
  double dStack_28;
  int exponential;
  double fraction;
  char **ppcStack_18;
  int signal;
  char **endptr_local;
  char *nptr_local;
  
  fraction._4_4_ = 1;
  local_44 = 0.0;
  val = (double)nptr;
  ppcStack_18 = endptr;
  if (nptr != (char *)0x0) {
    endptr_local = (char **)nptr;
    FVar1 = splitFloatString(nptr,(char **)&val,(int *)((long)&fraction + 4),
                             &stack0xffffffffffffffd8,(int *)((long)&runner + 4));
    switch(FVar1) {
    case FST_INFINITY:
      local_44 = (float)fraction._4_4_ * INFINITY;
      piVar2 = __errno_location();
      *piVar2 = 0;
      break;
    case FST_NAN:
      local_44 = NAN;
      break;
    case FST_NUMBER:
      dVar3 = pow(10.0,(double)runner._4_4_);
      dVar3 = dStack_28 * dVar3 * (double)fraction._4_4_;
      if ((dVar3 < -3.4028234663852886e+38) || (3.4028234663852886e+38 < dVar3)) {
        local_44 = (float)fraction._4_4_ * INFINITY;
        piVar2 = __errno_location();
        *piVar2 = 0x22;
      }
      else {
        local_44 = (float)dVar3;
      }
      break;
    case FST_OVERFLOW:
      local_44 = (float)fraction._4_4_ * INFINITY;
      piVar2 = __errno_location();
      *piVar2 = 0x22;
      break;
    default:
      val = (double)endptr_local;
    }
  }
  if (ppcStack_18 != (char **)0x0) {
    *ppcStack_18 = (char *)val;
  }
  return local_44;
}

Assistant:

float strtof_s(const char* nptr, char** endptr)
{
    int signal = 1;
    double fraction;
    int exponential;
    char* runner = (char*)nptr;
    double val;

    /*Codes_SRS_CRT_ABSTRACTIONS_21_021: [If no conversion could be performed, the strtof_s returns the value 0.0.]*/
    float result = 0.0;

    /*Codes_SRS_CRT_ABSTRACTIONS_21_036: [**If the nptr is NULL, the strtof_s must not perform any conversion and must returns 0.0f; endptr must receive NULL, provided that endptr is not a NULL pointer.]*/
    if (nptr != NULL)
    {
        switch (splitFloatString(nptr, &runner, &signal, &fraction, &exponential))
        {
        case FST_INFINITY:
            /*Codes_SRS_CRT_ABSTRACTIONS_21_023: [If the string is 'INF' of 'INFINITY' (ignoring case), the strtof_s must return the INFINITY value for float.]*/
            result = INFINITY * (signal);
            errno = 0;
            break;
        case FST_NAN:
            /*Codes_SRS_CRT_ABSTRACTIONS_21_024: [If the string is 'NAN' or 'NAN(...)' (ignoring case), the strtof_s must return 0.0f and points endptr to the first character after the 'NAN' sequence.]*/
            result = NAN;
            break;
        case FST_NUMBER:
            val = fraction * pow((double)10.0, (double)exponential) * (double)signal;
            if ((val >= ((double)FLT_MAX * (-1.0))) && (val <= (double)FLT_MAX))
            {
                /*Codes_SRS_CRT_ABSTRACTIONS_21_016: [The strtof_s must return the float that represents the value in the initial part of the string. If any.]*/
                result = (float)val;
            }
            else
            {
                /*Codes_SRS_CRT_ABSTRACTIONS_21_022: [If the correct value is outside the range, the strtof_s returns the value plus or minus HUGE_VALF, and errno will receive the value ERANGE.]*/
                result = HUGE_VALF * (signal);
                errno = ERANGE;
            }
            break;
        case FST_OVERFLOW:
            /*Codes_SRS_CRT_ABSTRACTIONS_21_022: [If the correct value is outside the range, the strtof_s returns the value plus or minus HUGE_VALF, and errno will receive the value ERANGE.]*/
            result = HUGE_VALF * (signal);
            errno = ERANGE;
            break;
        default:
            /*Codes_SRS_CRT_ABSTRACTIONS_21_020: [If the subject sequence is empty or does not have the expected form, the strtof_s must not perform any conversion and must returns 0.0f; the value of nptr is stored in the object pointed to by endptr, provided that endptr is not a NULL pointer.]*/
            runner = (char*)nptr;
            break;
        }
    }

    /*Codes_SRS_CRT_ABSTRACTIONS_21_017: [The strtof_s must return in endptr a final string of one or more unrecognized characters, including the terminating null character of the input string.]*/
    if (endptr != NULL)
    {
        (*endptr) = runner;
    }

    return result;
}